

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

void __thiscall
mjs::anon_unknown_46::json_lexer::json_lexer
          (json_lexer *this,gc_heap_ptr<mjs::global_object> *global,wstring *text)

{
  json_token local_60;
  wstring *local_20;
  wstring *text_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  json_lexer *this_local;
  
  local_20 = text;
  text_local = (wstring *)global;
  global_local = &this->global_;
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&this->global_,global);
  std::__cxx11::wstring::wstring((wstring *)&this->text_,(wstring *)local_20);
  this->pos_ = 0;
  json_token::json_token(&this->tok_,eof,0);
  next_token(&local_60,this);
  json_token::~json_token(&local_60);
  return;
}

Assistant:

explicit json_lexer(const gc_heap_ptr<global_object>& global, std::wstring&& text)
        : global_{global}
        , text_{std::move(text)}
        , pos_{0}
        , tok_{json_token_type::eof, 0} {
        next_token();
    }